

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O0

path * boost::filesystem::detail::canonical
                 (path *__return_storage_ptr__,path *p,path *base,error_code *ec)

{
  bool bVar1;
  type tVar2;
  file_type fVar3;
  filesystem_error *pfVar4;
  error_category *peVar5;
  unspecified_bool_type p_Var6;
  reference ppVar7;
  path *ppVar8;
  error_code ec_00;
  error_code ec_01;
  iterator local_240;
  undefined1 local_210 [8];
  path new_source;
  undefined1 local_1c0 [8];
  path link;
  undefined1 local_190 [7];
  bool is_sym;
  undefined1 local_160 [8];
  iterator itr;
  bool scan;
  allocator<char> local_111;
  string local_110;
  int local_f0;
  undefined1 local_e9;
  error_code local_e8;
  allocator<char> local_d1;
  string local_d0;
  file_status local_b0;
  file_status stat;
  error_code local_a0;
  path result;
  undefined1 local_68 [8];
  path root;
  path source;
  error_code *ec_local;
  path *base_local;
  path *p_local;
  
  bVar1 = filesystem::path::is_absolute(p);
  if (bVar1) {
    filesystem::path::path((path *)((long)&root.m_pathname.field_2 + 8),p);
  }
  else {
    absolute((path *)((long)&root.m_pathname.field_2 + 8),p,base);
  }
  filesystem::path::root_path((path *)local_68,(path *)((long)&root.m_pathname.field_2 + 8));
  filesystem::path::path((path *)&local_a0.m_cat);
  system::error_code::error_code((error_code *)&stat);
  filesystem::status((filesystem *)&local_b0,(path *)((long)&root.m_pathname.field_2 + 8),
                     (error_code *)&stat);
  fVar3 = file_status::type(&local_b0);
  if (fVar3 == file_not_found) {
    if (ec == (error_code *)0x0) {
      local_e9 = 1;
      pfVar4 = (filesystem_error *)__cxa_allocate_exception(0x50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"boost::filesystem::canonical",&local_d1);
      peVar5 = system::generic_category();
      system::error_code::error_code(&local_e8,2,peVar5);
      ec_00._4_4_ = 0;
      ec_00.m_val = local_e8.m_val;
      ec_00.m_cat = local_e8.m_cat;
      filesystem_error::filesystem_error
                (pfVar4,&local_d0,(path *)((long)&root.m_pathname.field_2 + 8),ec_00);
      local_e9 = 0;
      __cxa_throw(pfVar4,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
    }
    peVar5 = system::generic_category();
    system::error_code::assign(ec,2,peVar5);
    filesystem::path::path(__return_storage_ptr__,(path *)&local_a0.m_cat);
    local_f0 = 1;
  }
  else {
    p_Var6 = system::error_code::operator_cast_to_function_pointer((error_code *)&stat);
    if (p_Var6 == (unspecified_bool_type)0x0) {
      itr.m_pos._6_1_ = 1;
      do {
        if ((itr.m_pos._6_1_ & 1) == 0) {
          if (ec != (error_code *)0x0) {
            system::error_code::clear(ec);
          }
          bVar1 = filesystem::path::is_absolute((path *)&local_a0.m_cat);
          if (!bVar1) {
            __assert_fail("(result.is_absolute())&&(\"canonical() implementation error; please report\")"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Naios[P]boost-minimal-dist/libs/filesystem/src/operations.cpp"
                          ,0x368,
                          "path boost::filesystem::detail::canonical(const path &, const path &, system::error_code *)"
                         );
          }
          filesystem::path::path(__return_storage_ptr__,(path *)&local_a0.m_cat);
          local_f0 = 1;
          break;
        }
        itr.m_pos._6_1_ = 0;
        filesystem::path::clear((path *)&local_a0.m_cat);
        filesystem::path::begin((iterator *)local_160,(path *)((long)&root.m_pathname.field_2 + 8));
        while( true ) {
          filesystem::path::end((iterator *)local_190,(path *)((long)&root.m_pathname.field_2 + 8));
          tVar2 = iterators::operator!=
                            ((iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                              *)local_160,
                             (iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                              *)local_190);
          filesystem::path::iterator::~iterator((iterator *)local_190);
          if (!tVar2) break;
          ppVar7 = iterators::detail::
                   iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                   ::operator*((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                                *)local_160);
          ppVar8 = dot_path();
          bVar1 = operator==(ppVar7,ppVar8);
          if (!bVar1) {
            ppVar7 = iterators::detail::
                     iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                     ::operator*((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                                  *)local_160);
            ppVar8 = dot_dot_path();
            bVar1 = operator==(ppVar7,ppVar8);
            if (bVar1) {
              bVar1 = operator!=((path *)&local_a0.m_cat,(path *)local_68);
              if (bVar1) {
                filesystem::path::remove_filename((path *)&local_a0.m_cat);
              }
              goto LAB_00111fd6;
            }
            ppVar7 = iterators::detail::
                     iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                     ::operator*((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                                  *)local_160);
            filesystem::path::operator/=((path *)&local_a0.m_cat,ppVar7);
            symlink_status((detail *)(link.m_pathname.field_2._M_local_buf + 0xc),
                           (path *)&local_a0.m_cat,ec);
            bVar1 = is_symlink((file_status *)((long)&link.m_pathname.field_2 + 0xc));
            if ((ec == (error_code *)0x0) ||
               (p_Var6 = system::error_code::operator_cast_to_function_pointer(ec),
               p_Var6 == (unspecified_bool_type)0x0)) {
              if (!bVar1) goto LAB_00111fd6;
              read_symlink((path *)local_1c0,(path *)&local_a0.m_cat,ec);
              if ((ec == (error_code *)0x0) ||
                 (p_Var6 = system::error_code::operator_cast_to_function_pointer(ec),
                 p_Var6 == (unspecified_bool_type)0x0)) {
                filesystem::path::remove_filename((path *)&local_a0.m_cat);
                bVar1 = filesystem::path::is_absolute((path *)local_1c0);
                if (bVar1) {
                  iterators::detail::
                  iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                  ::operator++((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                                *)local_160);
                  while( true ) {
                    filesystem::path::end
                              ((iterator *)((long)&new_source.m_pathname.field_2 + 8),
                               (path *)((long)&root.m_pathname.field_2 + 8));
                    tVar2 = iterators::operator!=
                                      ((iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                                        *)local_160,
                                       (iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                                        *)(new_source.m_pathname.field_2._M_local_buf + 8));
                    filesystem::path::iterator::~iterator
                              ((iterator *)((long)&new_source.m_pathname.field_2 + 8));
                    if (!tVar2) break;
                    ppVar7 = iterators::detail::
                             iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                             ::operator*((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                                          *)local_160);
                    filesystem::path::operator/=((path *)local_1c0,ppVar7);
                    iterators::detail::
                    iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                    ::operator++((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                                  *)local_160);
                  }
                  filesystem::path::operator=
                            ((path *)((long)&root.m_pathname.field_2 + 8),(path *)local_1c0);
                }
                else {
                  filesystem::path::path((path *)local_210,(path *)&local_a0.m_cat);
                  filesystem::path::operator/=((path *)local_210,(path *)local_1c0);
                  iterators::detail::
                  iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                  ::operator++((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                                *)local_160);
                  while( true ) {
                    filesystem::path::end(&local_240,(path *)((long)&root.m_pathname.field_2 + 8));
                    tVar2 = iterators::operator!=
                                      ((iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                                        *)local_160,
                                       (iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                                        *)&local_240);
                    filesystem::path::iterator::~iterator(&local_240);
                    if (!tVar2) break;
                    ppVar7 = iterators::detail::
                             iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                             ::operator*((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                                          *)local_160);
                    filesystem::path::operator/=((path *)local_210,ppVar7);
                    iterators::detail::
                    iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                    ::operator++((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                                  *)local_160);
                  }
                  filesystem::path::operator=
                            ((path *)((long)&root.m_pathname.field_2 + 8),(path *)local_210);
                  filesystem::path::~path((path *)local_210);
                }
                itr.m_pos._6_1_ = 1;
                local_f0 = 4;
              }
              else {
                filesystem::path::path(__return_storage_ptr__);
                local_f0 = 1;
              }
              filesystem::path::~path((path *)local_1c0);
            }
            else {
              filesystem::path::path(__return_storage_ptr__);
              local_f0 = 1;
            }
            goto LAB_00111fe9;
          }
LAB_00111fd6:
          iterators::detail::
          iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
          ::operator++((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                        *)local_160);
        }
        local_f0 = 4;
LAB_00111fe9:
        filesystem::path::iterator::~iterator((iterator *)local_160);
      } while (local_f0 == 4);
    }
    else {
      if (ec == (error_code *)0x0) {
        itr.m_pos._7_1_ = 1;
        pfVar4 = (filesystem_error *)__cxa_allocate_exception(0x50);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,"boost::filesystem::canonical",&local_111);
        ec_01._0_8_ = (ulong)stat & 0xffffffff;
        ec_01.m_cat = (error_category *)local_a0._0_8_;
        filesystem_error::filesystem_error
                  (pfVar4,&local_110,(path *)((long)&root.m_pathname.field_2 + 8),ec_01);
        itr.m_pos._7_1_ = 0;
        __cxa_throw(pfVar4,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
      }
      ec->m_val = stat.m_value;
      *(perms *)&ec->field_0x4 = stat.m_perms;
      ec->m_cat = (error_category *)local_a0._0_8_;
      filesystem::path::path(__return_storage_ptr__,(path *)&local_a0.m_cat);
      local_f0 = 1;
    }
  }
  filesystem::path::~path((path *)&local_a0.m_cat);
  filesystem::path::~path((path *)local_68);
  filesystem::path::~path((path *)((long)&root.m_pathname.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

BOOST_FILESYSTEM_DECL
  path canonical(const path& p, const path& base, system::error_code* ec)
  {
    path source (p.is_absolute() ? p : absolute(p, base));
    path root(source.root_path());
    path result;

    system::error_code local_ec;
    file_status stat (status(source, local_ec));

    if (stat.type() == fs::file_not_found)
    {
      if (ec == 0)
        BOOST_FILESYSTEM_THROW(filesystem_error(
          "boost::filesystem::canonical", source,
          error_code(system::errc::no_such_file_or_directory, system::generic_category())));
      ec->assign(system::errc::no_such_file_or_directory, system::generic_category());
      return result;
    }
    else if (local_ec)
    {
      if (ec == 0)
        BOOST_FILESYSTEM_THROW(filesystem_error(
          "boost::filesystem::canonical", source, local_ec));
      *ec = local_ec;
      return result;
    }

    bool scan (true);
    while (scan)
    {
      scan = false;
      result.clear();
      for (path::iterator itr = source.begin(); itr != source.end(); ++itr)
      {
        if (*itr == dot_path())
          continue;
        if (*itr == dot_dot_path())
        {
          if (result != root)
            result.remove_filename();
          continue;
        }

        result /= *itr;

        bool is_sym (is_symlink(detail::symlink_status(result, ec)));
        if (ec && *ec)
          return path();

        if (is_sym)
        {
          path link(detail::read_symlink(result, ec));
          if (ec && *ec)
            return path();
          result.remove_filename();

          if (link.is_absolute())
          {
            for (++itr; itr != source.end(); ++itr)
              link /= *itr;
            source = link;
          }
          else // link is relative
          {
            path new_source(result);
            new_source /= link;
            for (++itr; itr != source.end(); ++itr)
              new_source /= *itr;
            source = new_source;
          }
          scan = true;  // symlink causes scan to be restarted
          break;
        }
      }
    }
    if (ec != 0)
      ec->clear();
    BOOST_ASSERT_MSG(result.is_absolute(), "canonical() implementation error; please report");
    return result;
  }